

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcSymFunc * __thiscall CTPNCodeBodyBase::get_replaced_func(CTPNCodeBodyBase *this)

{
  CTcSymFunc *pCVar1;
  CTcCodeBodyRef *pCVar2;
  
  do {
    pCVar1 = (((CTPNCodeBody *)this)->super_CTPNCodeBodyBase).fixup_owner_sym_;
    if (pCVar1 != (CTcSymFunc *)0x0) {
      return (pCVar1->super_CTcSymFuncBase).mod_base_;
    }
    pCVar2 = (((CTPNCodeBody *)this)->super_CTPNCodeBodyBase).enclosing_code_body_;
    if (pCVar2 == (CTcCodeBodyRef *)0x0) {
      this = (CTPNCodeBodyBase *)0x0;
    }
    else {
      this = &pCVar2->ptr->super_CTPNCodeBodyBase;
    }
  } while ((CTPNCodeBody *)this != (CTPNCodeBody *)0x0);
  return (CTcSymFunc *)0x0;
}

Assistant:

class CTcSymFunc *CTPNCodeBodyBase::get_replaced_func() const
{
    CTcSymFunc *b;
    CTPNCodeBody *enc;

    /* if we have an associated function symbol, it's the base function */
    if ((b = get_func_sym()) != 0)
        return b->get_mod_base();

    /* 
     *   if we have an enclosing code body, then 'replaced' here means the
     *   same thing it does there, since we don't explicitly replace anything
     *   here 
     */
    if ((enc = get_enclosing()) != 0)
        return enc->get_replaced_func();

    /* if we haven't found anything yet, we don't have a base function */
    return 0;
}